

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-shape.cpp
# Opt level: O2

Comparison __thiscall
wasm::anon_unknown_0::
RecGroupComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type-shape.cpp:320:29)>
::compare(RecGroupComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_type_shape_cpp:320:29)>
          *this,Field a,Field b)

{
  bool bVar1;
  bool bVar2;
  Comparison CVar3;
  undefined1 local_38 [8];
  Field a_local;
  Field b_local;
  
  a_local._8_8_ = b.type.id;
  a_local.type.id = a._8_8_;
  local_38 = (undefined1  [8])a.type.id;
  if (a_local.type.id >> 0x20 == b._8_8_ >> 0x20) {
    bVar1 = Field::isPacked((Field *)local_38);
    bVar2 = Field::isPacked((Field *)&a_local.packedType);
    if (bVar1 != bVar2) {
      bVar1 = Field::isPacked((Field *)&a_local.packedType);
      bVar2 = Field::isPacked((Field *)local_38);
      return GT - (!bVar1 && bVar2);
    }
    b_local.type.id._0_4_ = b.packedType;
    if ((PackedType)a_local.type.id == (PackedType)b_local.type.id) {
      CVar3 = compare(this,(Type)local_38,(Type)a_local._8_8_);
      return CVar3;
    }
    bVar1 = (int)(PackedType)b_local.type.id <= (int)(PackedType)a_local.type.id;
  }
  else {
    bVar1 = (int)b.mutable_ <= (int)a.mutable_;
  }
  return bVar1 + LT;
}

Assistant:

Comparison compare(Field a, Field b) {
    if (a.mutable_ != b.mutable_) {
      return a.mutable_ < b.mutable_ ? LT : GT;
    }
    if (a.isPacked() != b.isPacked()) {
      return b.isPacked() < a.isPacked() ? LT : GT;
    }
    if (a.packedType != b.packedType) {
      return a.packedType < b.packedType ? LT : GT;
    }
    return compare(a.type, b.type);
  }